

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  long *plVar5;
  size_type *psVar6;
  string tmp;
  stringstream out;
  string local_2b8;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined1 *local_278;
  char *local_270;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 *local_218;
  char *local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_display_name_abi_cxx11_(&local_2b8,sub);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  paVar1 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_2b8,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_2b8,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  make_groups_abi_cxx11_(&local_2b8,this,sub,Sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_2b8,this,sub,2);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  ::std::__cxx11::stringbuf::str();
  local_218 = local_208;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\n\n","");
  local_1d8 = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\n","");
  uVar4 = ::std::__cxx11::string::find((char *)&local_258,(ulong)local_218,0);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::string::replace((ulong)&local_258,uVar4,local_210,(ulong)local_1d8);
      uVar4 = ::std::__cxx11::string::find((char *)&local_258,(ulong)local_218,uVar4 + local_1d0);
    } while (uVar4 != 0xffffffffffffffff);
  }
  if (local_258 == &local_248) {
    local_2b8.field_2._8_8_ = local_248._8_8_;
    local_2b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b8._M_dataplus._M_p = (pointer)local_258;
  }
  local_2b8._M_string_length = local_250;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_258 = &local_248;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  ::std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_2b8);
  ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_238);
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  local_298 = local_288;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_278 = local_268;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"\n","");
  local_1f8 = local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\n  ","");
  uVar4 = ::std::__cxx11::string::find((char *)&local_298,(ulong)local_278,0);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::string::replace((ulong)&local_298,uVar4,local_270,(ulong)local_1f8);
      uVar4 = ::std::__cxx11::string::find((char *)&local_298,(ulong)local_278,uVar4 + local_1f0);
    } while (uVar4 != 0xffffffffffffffff);
  }
  if (local_298 == local_288) {
    uStack_220 = uStack_280;
    local_238 = local_228;
  }
  else {
    local_238 = local_298;
  }
  local_230 = local_290;
  local_290 = 0;
  local_288[0] = 0;
  local_298 = local_288;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_238);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name() << "\n";

    out << make_description(sub);
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1); // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}